

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_Message(FParser *this)

{
  bool bVar1;
  AActor *pAVar2;
  char *pcVar3;
  FParser *local_10;
  FParser *this_local;
  
  if ((0 < this->t_argc) &&
     (local_10 = this,
     pAVar2 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger),
     pAVar2 != (AActor *)0x0)) {
    pAVar2 = TObjPtr<AActor>::operator->(&this->Script->trigger);
    bVar1 = AActor::CheckLocalView(pAVar2,consoleplayer);
    if (bVar1) {
      GetFormatString((FParser *)&stack0xffffffffffffffe8,(int)this);
      pcVar3 = FString::GetChars((FString *)&stack0xffffffffffffffe8);
      Printf(2,"%s\n",pcVar3);
      FString::~FString((FString *)&stack0xffffffffffffffe8);
    }
  }
  return;
}

Assistant:

void FParser::SF_Message(void)
{
	if (t_argc>0 && Script->trigger &&
		Script->trigger->CheckLocalView(consoleplayer))
	{
		Printf(PRINT_HIGH, "%s\n", GetFormatString(0).GetChars());
	}
}